

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::WriteHeader(cmGraphVizWriter *this,cmGeneratedFileStream *fs,string *name)

{
  ostream *poVar1;
  string escapedGraphName;
  
  EscapeForDotFile(&escapedGraphName,name);
  poVar1 = std::operator<<((ostream *)fs,"digraph \"");
  poVar1 = std::operator<<(poVar1,(string *)&escapedGraphName);
  poVar1 = std::operator<<(poVar1,"\" {\n");
  poVar1 = std::operator<<(poVar1,(string *)&this->GraphHeader);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&escapedGraphName);
  return;
}

Assistant:

void cmGraphVizWriter::WriteHeader(cmGeneratedFileStream& fs,
                                   const std::string& name)
{
  auto const escapedGraphName = EscapeForDotFile(name);
  fs << "digraph \"" << escapedGraphName << "\" {\n"
     << this->GraphHeader << '\n';
}